

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O1

void bssl::ssl_cipher_apply_rule
               (uint32_t cipher_id,CIPHER_ALIAS *alias,int rule,int strength_bits,bool in_group,
               CIPHER_ORDER **head_p,CIPHER_ORDER **tail_p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  cipher_order_st *pcVar4;
  SSL_CIPHER *c;
  cipher_order_st *pcVar5;
  CIPHER_ORDER *pCVar6;
  int iVar7;
  CIPHER_ORDER *pCVar8;
  CIPHER_ORDER *pCVar9;
  uint16_t uVar10;
  CIPHER_ORDER *pCVar11;
  CIPHER_ORDER *local_58;
  
  if (((strength_bits != -1 || cipher_id != 0) || (alias->min_version != 0)) ||
     ((alias->algorithm_mkey != 0 &&
      (((alias->algorithm_auth != 0 && (alias->algorithm_enc != 0)) && (alias->algorithm_mac != 0)))
      ))) {
    pCVar11 = *head_p;
    local_58 = *tail_p;
    pCVar8 = local_58;
    pCVar9 = pCVar11;
    if (rule == 3) {
      pCVar8 = pCVar11;
      pCVar9 = local_58;
    }
    if (pCVar9 != (CIPHER_ORDER *)0x0 && pCVar8 != (CIPHER_ORDER *)0x0) {
      do {
        while( true ) {
          pcVar4 = (&pCVar9->next)[rule == 3];
          c = (SSL_CIPHER *)pCVar9->cipher;
          if (cipher_id == 0) break;
          if ((uint32_t)c->id != cipher_id) goto LAB_0025fdc3;
LAB_0025fe55:
          if (rule == 4) {
            if (pCVar9->active == true) {
              if (local_58 != pCVar9) {
                if (pCVar11 == pCVar9) {
                  pCVar11 = pCVar9->next;
                }
                pcVar5 = pCVar9->prev;
                if (pcVar5 != (cipher_order_st *)0x0) {
                  pcVar5->next = pCVar9->next;
                }
                if (pCVar9->next != (cipher_order_st *)0x0) {
                  pCVar9->next->prev = pcVar5;
                }
                local_58->next = pCVar9;
                pCVar9->prev = local_58;
                pCVar9->next = (cipher_order_st *)0x0;
                local_58 = pCVar9;
              }
              pCVar9->in_group = false;
            }
          }
          else if (rule == 1) {
            if (pCVar9->active == false) {
              if (local_58 != pCVar9) {
                if (pCVar11 == pCVar9) {
                  pCVar11 = pCVar9->next;
                }
                pcVar5 = pCVar9->prev;
                if (pcVar5 != (cipher_order_st *)0x0) {
                  pcVar5->next = pCVar9->next;
                }
                if (pCVar9->next != (cipher_order_st *)0x0) {
                  pCVar9->next->prev = pcVar5;
                }
                local_58->next = pCVar9;
                pCVar9->prev = local_58;
                pCVar9->next = (cipher_order_st *)0x0;
                local_58 = pCVar9;
              }
              pCVar9->active = true;
              pCVar9->in_group = in_group;
            }
          }
          else if (rule == 3) {
            if (pCVar9->active == true) {
              if (pCVar11 != pCVar9) {
                if (local_58 == pCVar9) {
                  local_58 = pCVar9->prev;
                }
                pcVar5 = pCVar9->next;
                if (pcVar5 != (cipher_order_st *)0x0) {
                  pcVar5->prev = pCVar9->prev;
                }
                if (pCVar9->prev != (cipher_order_st *)0x0) {
                  pCVar9->prev->next = pcVar5;
                }
                pCVar11->prev = pCVar9;
                pCVar9->next = pCVar11;
                pCVar9->prev = (cipher_order_st *)0x0;
                pCVar11 = pCVar9;
              }
              pCVar9->active = false;
              pCVar9->in_group = false;
            }
          }
          else if (rule == 2) {
            pCVar6 = pCVar9->next;
            if (pCVar11 != pCVar9) {
              pCVar9->prev->next = pCVar9->next;
              pCVar6 = pCVar11;
            }
            pCVar11 = pCVar6;
            if (local_58 == pCVar9) {
              local_58 = pCVar9->prev;
            }
            pCVar9->active = false;
            pcVar5 = pCVar9->next;
            if (pcVar5 != (cipher_order_st *)0x0) {
              pcVar5->prev = pCVar9->prev;
            }
            if (pCVar9->prev != (cipher_order_st *)0x0) {
              pCVar9->prev->next = pcVar5;
            }
            pCVar9->next = (cipher_order_st *)0x0;
            pCVar9->prev = (cipher_order_st *)0x0;
          }
          if ((pCVar9 == pCVar8) || (pCVar9 = pcVar4, pcVar4 == (cipher_order_st *)0x0))
          goto LAB_0025fffa;
        }
        if (strength_bits < 0) {
          uVar1 = *(uint *)((long)&c->id + 4);
          if ((((alias->algorithm_mkey & uVar1) != 0) &&
              (uVar2 = (uint)c->algorithm_mkey, (alias->algorithm_auth & uVar2) != 0)) &&
             ((uVar3 = *(uint *)((long)&c->algorithm_mkey + 4), (alias->algorithm_enc & uVar3) != 0
              && ((alias->algorithm_mac & (uint)c->algorithm_auth) != 0)))) {
            if (alias->min_version != 0) {
              uVar10 = 0x304;
              if (uVar2 != 0x10 && uVar1 != 8) {
                uVar10 = (ushort)(*(int *)((long)&c->algorithm_auth + 4) != 1) * 3 + 0x300;
              }
              if (uVar10 != alias->min_version) goto LAB_0025fdc3;
            }
            if ((alias->include_deprecated != false) || ((uVar3 != 1 && ((int)c->id != 0x300c027))))
            goto LAB_0025fe55;
          }
        }
        else {
          iVar7 = SSL_CIPHER_get_bits(c,(int *)0x0);
          if (iVar7 == strength_bits) goto LAB_0025fe55;
        }
LAB_0025fdc3:
      } while ((pCVar9 != pCVar8) && (pCVar9 = pcVar4, pcVar4 != (cipher_order_st *)0x0));
    }
LAB_0025fffa:
    *head_p = pCVar11;
    *tail_p = local_58;
  }
  return;
}

Assistant:

static void ssl_cipher_apply_rule(uint32_t cipher_id, const CIPHER_ALIAS *alias,
                                  int rule, int strength_bits, bool in_group,
                                  CIPHER_ORDER **head_p,
                                  CIPHER_ORDER **tail_p) {
  CIPHER_ORDER *head, *tail, *curr, *next, *last;
  const SSL_CIPHER *cp;
  bool reverse = false;

  if (cipher_id == 0 && strength_bits == -1 && alias->min_version == 0 &&
      (alias->algorithm_mkey == 0 || alias->algorithm_auth == 0 ||
       alias->algorithm_enc == 0 || alias->algorithm_mac == 0)) {
    // The rule matches nothing, so bail early.
    return;
  }

  if (rule == CIPHER_DEL) {
    // needed to maintain sorting between currently deleted ciphers
    reverse = true;
  }

  head = *head_p;
  tail = *tail_p;

  if (reverse) {
    next = tail;
    last = head;
  } else {
    next = head;
    last = tail;
  }

  curr = NULL;
  for (;;) {
    if (curr == last) {
      break;
    }

    curr = next;
    if (curr == NULL) {
      break;
    }

    next = reverse ? curr->prev : curr->next;
    cp = curr->cipher;

    // Selection criteria is either a specific cipher, the value of
    // |strength_bits|, or the algorithms used.
    if (cipher_id != 0) {
      if (cipher_id != cp->id) {
        continue;
      }
    } else if (strength_bits >= 0) {
      if (strength_bits != SSL_CIPHER_get_bits(cp, NULL)) {
        continue;
      }
    } else {
      if (!(alias->algorithm_mkey & cp->algorithm_mkey) ||
          !(alias->algorithm_auth & cp->algorithm_auth) ||
          !(alias->algorithm_enc & cp->algorithm_enc) ||
          !(alias->algorithm_mac & cp->algorithm_mac) ||
          (alias->min_version != 0 &&
           SSL_CIPHER_get_min_version(cp) != alias->min_version) ||
          (!alias->include_deprecated && ssl_cipher_is_deprecated(cp))) {
        continue;
      }
    }

    // add the cipher if it has not been added yet.
    if (rule == CIPHER_ADD) {
      // reverse == false
      if (!curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->active = true;
        curr->in_group = in_group;
      }
    }

    // Move the added cipher to this location
    else if (rule == CIPHER_ORD) {
      // reverse == false
      if (curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->in_group = false;
      }
    } else if (rule == CIPHER_DEL) {
      // reverse == true
      if (curr->active) {
        // most recently deleted ciphersuites get best positions
        // for any future CIPHER_ADD (note that the CIPHER_DEL loop
        // works in reverse to maintain the order)
        ll_append_head(&head, curr, &tail);
        curr->active = false;
        curr->in_group = false;
      }
    } else if (rule == CIPHER_KILL) {
      // reverse == false
      if (head == curr) {
        head = curr->next;
      } else {
        curr->prev->next = curr->next;
      }

      if (tail == curr) {
        tail = curr->prev;
      }
      curr->active = false;
      if (curr->next != NULL) {
        curr->next->prev = curr->prev;
      }
      if (curr->prev != NULL) {
        curr->prev->next = curr->next;
      }
      curr->next = NULL;
      curr->prev = NULL;
    }
  }

  *head_p = head;
  *tail_p = tail;
}